

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_make_socket_closeonexec(int fd)

{
  uint uVar1;
  int iVar2;
  int flags;
  int fd_local;
  
  uVar1 = fcntl(fd,1,0);
  if ((int)uVar1 < 0) {
    event_warn("fcntl(%d, F_GETFD)",(ulong)(uint)fd);
    flags = -1;
  }
  else if (((uVar1 & 1) == 0) && (iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1)), iVar2 == -1)) {
    event_warn("fcntl(%d, F_SETFD)",(ulong)(uint)fd);
    flags = -1;
  }
  else {
    flags = 0;
  }
  return flags;
}

Assistant:

int
evutil_make_socket_closeonexec(evutil_socket_t fd)
{
#if !defined(_WIN32) && defined(EVENT__HAVE_SETFD)
	int flags;
	if ((flags = fcntl(fd, F_GETFD, NULL)) < 0) {
		event_warn("fcntl(%d, F_GETFD)", fd);
		return -1;
	}
	if (!(flags & FD_CLOEXEC)) {
		if (fcntl(fd, F_SETFD, flags | FD_CLOEXEC) == -1) {
			event_warn("fcntl(%d, F_SETFD)", fd);
			return -1;
		}
	}
#endif
	return 0;
}